

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void cmsysProcess_SetOption(cmsysProcess *cp,int optionId,int value)

{
  if (cp != (cmsysProcess *)0x0) {
    switch(optionId) {
    case 1:
      cp->OptionDetach = value;
      return;
    case 2:
      cp->MergeOutput = value;
      return;
    case 3:
      cp->Verbatim = value;
      return;
    case 4:
      cp->CreateProcessGroup = value;
    }
  }
  return;
}

Assistant:

void kwsysProcess_SetOption(kwsysProcess* cp, int optionId, int value)
{
  if(!cp)
    {
    return;
    }

  switch(optionId)
    {
    case kwsysProcess_Option_Detach: cp->OptionDetach = value; break;
    case kwsysProcess_Option_MergeOutput: cp->MergeOutput = value; break;
    case kwsysProcess_Option_Verbatim: cp->Verbatim = value; break;
    case kwsysProcess_Option_CreateProcessGroup:
      cp->CreateProcessGroup = value; break;
    default: break;
    }
}